

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

bill_x * onbill(obj *obj,monst *shkp,boolean silent)

{
  bill_x *pbVar1;
  ushort uVar2;
  bool bVar3;
  int iVar4;
  bill_x *pbVar6;
  bill_x *pbVar7;
  int iVar5;
  
  if (shkp != (monst *)0x0) {
    uVar2 = *(ushort *)((long)&shkp[0x1b].misc_worn_check + 2);
    bVar3 = (short)uVar2 < 1;
    if (0 < (short)uVar2) {
      pbVar7 = *(bill_x **)&shkp[0x1b].mnum;
      if (pbVar7->bo_id != obj->o_id) {
        pbVar6 = pbVar7;
        iVar5 = uVar2 + 1;
        do {
          iVar4 = iVar5 + -1;
          bVar3 = iVar4 < 2;
          if (SBORROW4(iVar4,2) != iVar5 + -3 < 0) goto LAB_002399a0;
          pbVar7 = pbVar6 + 1;
          pbVar1 = pbVar6 + 1;
          pbVar6 = pbVar7;
          iVar5 = iVar4;
        } while (pbVar1->bo_id != obj->o_id);
      }
      if ((obj->field_0x4a & 4) == 0) {
        pline("onbill: paid obj on bill?");
      }
      if (!bVar3) {
        return pbVar7;
      }
    }
  }
LAB_002399a0:
  if ((silent == '\0') && ((*(uint *)&obj->field_0x4a & 4) != 0)) {
    pline("onbill: unpaid obj not on bill?");
  }
  return (bill_x *)0x0;
}

Assistant:

static struct bill_x *onbill(const struct obj *obj, struct monst *shkp, boolean silent)
{
	if (shkp) {
		struct bill_x *bp = ESHK(shkp)->bill_p;
		int ct = ESHK(shkp)->billct;

		while (--ct >= 0)
		    if (bp->bo_id == obj->o_id) {
			if (!obj->unpaid) pline("onbill: paid obj on bill?");
			return bp;
		    } else bp++;
	}
	if (obj->unpaid && !silent) pline("onbill: unpaid obj not on bill?");
	return NULL;
}